

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystemFrontend.cpp
# Opt level: O1

bool __thiscall
anon_unknown.dwarf_24d90a::BuildSystemFrontendImpl::initialize(BuildSystemFrontendImpl *this)

{
  atomic<unsigned_int> *paVar1;
  unique_ptr<llbuild::buildsystem::BuildSystem,_std::default_delete<llbuild::buildsystem::BuildSystem>_>
  *this_00;
  BuildSystem *this_01;
  BuildSystemInvocation *pBVar2;
  StringRef mainFilename;
  StringRef path;
  StringRef path_00;
  undefined1 RHSKind;
  bool bVar3;
  bool bVar4;
  int iVar5;
  Child CVar6;
  FileSystem *pFVar7;
  int *piVar8;
  char *pcVar9;
  size_t sVar10;
  Style SVar11;
  undefined1 LHSKind;
  BuildSystemFrontendDelegate *pBVar12;
  Child RHS;
  undefined4 uVar13;
  undefined4 uVar14;
  StringRef path_01;
  StringRef Str;
  StringRef path_02;
  string error_1;
  StringRef dir;
  string error;
  Child local_1f0;
  undefined8 uStack_1e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1e0;
  Child local_1d0;
  size_t local_1c8;
  Child local_1c0;
  undefined8 uStack_1b8;
  Child local_1b0 [2];
  Child local_1a0;
  size_t local_198;
  Twine local_188;
  Twine local_170;
  Child local_158;
  undefined8 uStack_150;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_148 [16];
  StringRef local_40;
  
  iVar5 = pthread_mutex_lock((pthread_mutex_t *)&this->stateMutex);
  if (iVar5 != 0) {
    std::__throw_system_error(iVar5);
  }
  LOCK();
  (this->delegateImpl->numFailedCommands).super___atomic_base<unsigned_int>._M_i = 0;
  UNLOCK();
  LOCK();
  paVar1 = &this->delegateImpl->numErrors;
  SVar11 = (paVar1->super___atomic_base<unsigned_int>)._M_i;
  (paVar1->super___atomic_base<unsigned_int>)._M_i = 0;
  UNLOCK();
  bVar3 = false;
  if (this->cancelled != false) goto LAB_00176a0e;
  this_01 = (this->system)._M_t.
            super___uniq_ptr_impl<llbuild::buildsystem::BuildSystem,_std::default_delete<llbuild::buildsystem::BuildSystem>_>
            ._M_t.
            super__Tuple_impl<0UL,_llbuild::buildsystem::BuildSystem_*,_std::default_delete<llbuild::buildsystem::BuildSystem>_>
            .super__Head_base<0UL,_llbuild::buildsystem::BuildSystem_*,_false>._M_head_impl;
  if (this_01 != (BuildSystem *)0x0) {
    llbuild::buildsystem::BuildSystem::resetForBuild(this_01);
    bVar3 = true;
    goto LAB_00176a0e;
  }
  if (((this->invocation->chdirPath)._M_string_length == 0) ||
     (iVar5 = llbuild::basic::sys::chdir((this->invocation->chdirPath)._M_dataplus._M_p),
     (char)iVar5 != '\0')) {
    if ((this->fileSystem)._M_t.
        super___uniq_ptr_impl<llbuild::basic::FileSystem,_std::default_delete<llbuild::basic::FileSystem>_>
        ._M_t.
        super__Tuple_impl<0UL,_llbuild::basic::FileSystem_*,_std::default_delete<llbuild::basic::FileSystem>_>
        .super__Head_base<0UL,_llbuild::basic::FileSystem_*,_false>._M_head_impl ==
        (FileSystem *)0x0) {
      pBVar12 = this->delegate;
      llvm::Twine::Twine((Twine *)&local_158,"invalid reuse after initialization failure");
      goto LAB_0017694d;
    }
    this_00 = &this->system;
    pBVar12 = this->delegate;
    CVar6.twine = (Twine *)operator_new(8);
    local_158 = (Child)(this->fileSystem)._M_t.
                       super___uniq_ptr_impl<llbuild::basic::FileSystem,_std::default_delete<llbuild::basic::FileSystem>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_llbuild::basic::FileSystem_*,_std::default_delete<llbuild::basic::FileSystem>_>
                       .super__Head_base<0UL,_llbuild::basic::FileSystem_*,_false>._M_head_impl;
    (this->fileSystem)._M_t.
    super___uniq_ptr_impl<llbuild::basic::FileSystem,_std::default_delete<llbuild::basic::FileSystem>_>
    ._M_t.
    super__Tuple_impl<0UL,_llbuild::basic::FileSystem_*,_std::default_delete<llbuild::basic::FileSystem>_>
    .super__Head_base<0UL,_llbuild::basic::FileSystem_*,_false>._M_head_impl = (FileSystem *)0x0;
    llbuild::buildsystem::BuildSystem::BuildSystem
              ((BuildSystem *)CVar6.twine,&pBVar12->super_BuildSystemDelegate,
               (unique_ptr<llbuild::basic::FileSystem,_std::default_delete<llbuild::basic::FileSystem>_>
                *)&local_158);
    local_1f0.twine = CVar6.twine;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_158.twine !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      (**(code **)(*local_158.decUL + 8))();
    }
    CVar6 = local_1f0;
    local_1f0.twine = (Twine *)0x0;
    std::
    __uniq_ptr_impl<llbuild::buildsystem::BuildSystem,_std::default_delete<llbuild::buildsystem::BuildSystem>_>
    ::reset((__uniq_ptr_impl<llbuild::buildsystem::BuildSystem,_std::default_delete<llbuild::buildsystem::BuildSystem>_>
             *)this_00,(pointer)CVar6.twine);
    std::
    unique_ptr<llbuild::buildsystem::BuildSystem,_std::default_delete<llbuild::buildsystem::BuildSystem>_>
    ::~unique_ptr((unique_ptr<llbuild::buildsystem::BuildSystem,_std::default_delete<llbuild::buildsystem::BuildSystem>_>
                   *)&local_1f0);
    mainFilename.Data = (this->invocation->buildFilePath)._M_dataplus._M_p;
    mainFilename.Length = (this->invocation->buildFilePath)._M_string_length;
    bVar3 = llbuild::buildsystem::BuildSystem::loadDescription
                      ((this->system)._M_t.
                       super___uniq_ptr_impl<llbuild::buildsystem::BuildSystem,_std::default_delete<llbuild::buildsystem::BuildSystem>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_llbuild::buildsystem::BuildSystem_*,_std::default_delete<llbuild::buildsystem::BuildSystem>_>
                       .super__Head_base<0UL,_llbuild::buildsystem::BuildSystem_*,_false>.
                       _M_head_impl,mainFilename);
    if (!bVar3) {
LAB_00176a01:
      bVar3 = false;
      std::
      __uniq_ptr_impl<llbuild::buildsystem::BuildSystem,_std::default_delete<llbuild::buildsystem::BuildSystem>_>
      ::reset((__uniq_ptr_impl<llbuild::buildsystem::BuildSystem,_std::default_delete<llbuild::buildsystem::BuildSystem>_>
               *)this_00,(pointer)0x0);
      goto LAB_00176a0e;
    }
    pcVar9 = (char *)(this->invocation->traceFilePath)._M_string_length;
    if (pcVar9 == (char *)0x0) {
LAB_00176a88:
      pBVar2 = this->invocation;
      bVar3 = true;
      if ((pBVar2->dbPath)._M_string_length == 0) goto LAB_00176a0e;
      local_158.twine = (Twine *)local_148;
      uStack_150 = 0x10000000000;
      local_1d0 = (Child)(pBVar2->dbPath)._M_dataplus._M_p;
      local_1c8 = (pBVar2->dbPath)._M_string_length;
      llvm::Twine::Twine((Twine *)&local_1f0,&pBVar2->dbPath);
      bVar4 = llvm::sys::path::is_relative((Twine *)&local_1f0,native);
      if (bVar4) {
        SVar11 = windows;
        Str.Length = 3;
        Str.Data = "://";
        sVar10 = llvm::StringRef::find((StringRef *)&local_1d0,Str,0);
        if ((sVar10 == 0xffffffffffffffff) && ((local_1c8 == 0 || (*local_1d0.cString != ':')))) {
          path_02.Length = 2;
          path_02.Data = (char *)(this->invocation->buildFilePath)._M_string_length;
          local_40 = llvm::sys::path::parent_path
                               ((path *)(this->invocation->buildFilePath)._M_dataplus._M_p,path_02,
                                SVar11);
          llvm::Twine::Twine((Twine *)&local_1f0,&local_40);
          llvm::Twine::Twine(&local_170,&this->invocation->dbPath);
          llvm::Twine::Twine(&local_188,"");
          llvm::Twine::Twine((Twine *)&local_1a0,"");
          llvm::sys::path::append
                    ((SmallVectorImpl<char> *)&local_158,(Twine *)&local_1f0,&local_170,&local_188,
                     (Twine *)&local_1a0);
          local_1c8 = uStack_150 & 0xffffffff;
          local_1d0.twine = local_158.twine;
        }
      }
      uStack_1e8 = 0;
      local_1e0._M_local_buf[0] = NullKind;
      path_00.Length = local_1c8;
      path_00.Data = local_1d0.cString;
      local_1f0.twine = (Twine *)&local_1e0;
      bVar4 = llbuild::buildsystem::BuildSystem::attachDB
                        ((this_00->_M_t).
                         super___uniq_ptr_impl<llbuild::buildsystem::BuildSystem,_std::default_delete<llbuild::buildsystem::BuildSystem>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_llbuild::buildsystem::BuildSystem_*,_std::default_delete<llbuild::buildsystem::BuildSystem>_>
                         .super__Head_base<0UL,_llbuild::buildsystem::BuildSystem_*,_false>.
                         _M_head_impl,path_00,(string *)&local_1f0);
      if (bVar4) {
        if (local_1f0.twine != (Twine *)&local_1e0) {
          operator_delete(local_1f0.twine,
                          CONCAT62(local_1e0._M_allocated_capacity._2_6_,
                                   CONCAT11(local_1e0._M_local_buf[1],local_1e0._M_local_buf[0])) +
                          1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_158.twine != local_148) {
          free(local_158.twine);
        }
        goto LAB_00176a0e;
      }
      pBVar12 = this->delegate;
      llvm::Twine::Twine(&local_188,"unable to attach DB: ");
      llvm::Twine::Twine((Twine *)&local_1a0,(string *)&local_1f0);
      llvm::operator+(&local_170,&local_188,(Twine *)&local_1a0);
      llbuild::buildsystem::BuildSystemFrontendDelegate::error(pBVar12,&local_170);
      std::
      __uniq_ptr_impl<llbuild::buildsystem::BuildSystem,_std::default_delete<llbuild::buildsystem::BuildSystem>_>
      ::reset((__uniq_ptr_impl<llbuild::buildsystem::BuildSystem,_std::default_delete<llbuild::buildsystem::BuildSystem>_>
               *)this_00,(pointer)0x0);
      if (local_1f0.twine != (Twine *)&local_1e0) {
        operator_delete(local_1f0.twine,
                        CONCAT62(local_1e0._M_allocated_capacity._2_6_,
                                 CONCAT11(local_1e0._M_local_buf[1],local_1e0._M_local_buf[0])) + 1)
        ;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_158.twine != local_148) {
        free(local_158.twine);
      }
    }
    else {
      path_01.Length = 2;
      path_01.Data = pcVar9;
      _local_1a0 = llvm::sys::path::parent_path
                             ((path *)(this->invocation->traceFilePath)._M_dataplus._M_p,path_01,
                              SVar11);
      pFVar7 = llbuild::buildsystem::BuildSystem::getFileSystem
                         ((this_00->_M_t).
                          super___uniq_ptr_impl<llbuild::buildsystem::BuildSystem,_std::default_delete<llbuild::buildsystem::BuildSystem>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_llbuild::buildsystem::BuildSystem_*,_std::default_delete<llbuild::buildsystem::BuildSystem>_>
                          .super__Head_base<0UL,_llbuild::buildsystem::BuildSystem_*,_false>.
                          _M_head_impl);
      local_1f0.twine = (Twine *)&local_1e0;
      if (local_1a0.twine == (Twine *)0x0) {
        uStack_1e8 = 0;
        local_1e0._M_local_buf[0] = NullKind;
      }
      else {
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_1f0,local_1a0.twine,
                   (char *)((long)&(local_1a0.twine)->LHS + local_198));
      }
      iVar5 = (*pFVar7->_vptr_FileSystem[3])(pFVar7,&local_1f0);
      if ((char)iVar5 == '\0') {
        pFVar7 = llbuild::buildsystem::BuildSystem::getFileSystem
                           ((this_00->_M_t).
                            super___uniq_ptr_impl<llbuild::buildsystem::BuildSystem,_std::default_delete<llbuild::buildsystem::BuildSystem>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_llbuild::buildsystem::BuildSystem_*,_std::default_delete<llbuild::buildsystem::BuildSystem>_>
                            .super__Head_base<0UL,_llbuild::buildsystem::BuildSystem_*,_false>.
                            _M_head_impl);
        local_1c0.twine = (Twine *)local_1b0;
        if (local_1a0.twine == (Twine *)0x0) {
          uStack_1b8 = 0;
          local_1b0[0].character = NullKind;
        }
        else {
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_1c0,local_1a0.twine,
                     (char *)((long)&(local_1a0.twine)->LHS + local_198));
        }
        (*pFVar7->_vptr_FileSystem[7])(&local_158,pFVar7,&local_1c0);
        bVar3 = llbuild::basic::FileInfo::isDirectory((FileInfo *)&local_158);
        bVar3 = !bVar3;
      }
      else {
        bVar3 = false;
      }
      if (((char)iVar5 == '\0') && (&(local_1c0.twine)->LHS != local_1b0)) {
        operator_delete(local_1c0.twine,
                        CONCAT62(local_1b0[0]._2_6_,
                                 CONCAT11(local_1b0[0].decUI._1_1_,local_1b0[0].character)) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f0.twine != &local_1e0) {
        operator_delete(local_1f0.twine,
                        CONCAT62(local_1e0._M_allocated_capacity._2_6_,
                                 CONCAT11(local_1e0._M_local_buf[1],local_1e0._M_local_buf[0])) + 1)
        ;
      }
      if (bVar3) {
        pBVar12 = this->delegate;
        llvm::Twine::Twine((Twine *)&local_158,"unable to create tracing directory: ",
                           (StringRef *)&local_1a0);
        llbuild::buildsystem::BuildSystemFrontendDelegate::error(pBVar12,(Twine *)&local_158);
        goto LAB_00176a01;
      }
      uStack_150 = 0;
      local_148[0]._M_allocated_capacity = local_148[0]._M_allocated_capacity & 0xffffffffffffff00;
      path.Data = (this->invocation->traceFilePath)._M_dataplus._M_p;
      path.Length = (this->invocation->traceFilePath)._M_string_length;
      local_158.twine = (Twine *)local_148;
      bVar3 = llbuild::buildsystem::BuildSystem::enableTracing
                        ((this->system)._M_t.
                         super___uniq_ptr_impl<llbuild::buildsystem::BuildSystem,_std::default_delete<llbuild::buildsystem::BuildSystem>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_llbuild::buildsystem::BuildSystem_*,_std::default_delete<llbuild::buildsystem::BuildSystem>_>
                         .super__Head_base<0UL,_llbuild::buildsystem::BuildSystem_*,_false>.
                         _M_head_impl,path,(string *)&local_158);
      if (bVar3) {
        if (local_158.twine != (Twine *)local_148) {
          operator_delete(local_158.twine,local_148[0]._M_allocated_capacity + 1);
        }
        goto LAB_00176a88;
      }
      pBVar12 = this->delegate;
      llvm::Twine::Twine(&local_170,"unable to enable tracing: ");
      llvm::Twine::Twine(&local_188,(string *)&local_158);
      llvm::operator+((Twine *)&local_1f0,&local_170,&local_188);
      llbuild::buildsystem::BuildSystemFrontendDelegate::error(pBVar12,(Twine *)&local_1f0);
      std::
      __uniq_ptr_impl<llbuild::buildsystem::BuildSystem,_std::default_delete<llbuild::buildsystem::BuildSystem>_>
      ::reset((__uniq_ptr_impl<llbuild::buildsystem::BuildSystem,_std::default_delete<llbuild::buildsystem::BuildSystem>_>
               *)this_00,(pointer)0x0);
      if (local_158.twine != (Twine *)local_148) {
        operator_delete(local_158.twine,local_148[0]._M_allocated_capacity + 1);
      }
    }
  }
  else {
    pBVar12 = this->delegate;
    llvm::Twine::Twine((Twine *)&local_1f0,"unable to honor --chdir: ");
    piVar8 = __errno_location();
    pcVar9 = strerror(*piVar8);
    llvm::Twine::Twine((Twine *)&local_1c0,pcVar9);
    if ((local_1e0._M_local_buf[0] == NullKind) || (local_1b0[0].character == NullKind)) {
      local_148[0]._0_2_ = 0x100;
    }
    else {
      if (local_1e0._M_local_buf[0] == EmptyKind) {
        local_148[0]._0_8_ =
             CONCAT62(local_1b0[0]._2_6_,CONCAT11(local_1b0[0].decUI._1_1_,local_1b0[0].character));
        local_158.decUI = local_1c0.decUI;
        local_158._4_4_ = local_1c0._4_4_;
        uVar13 = (undefined4)uStack_1b8;
        uVar14 = uStack_1b8._4_4_;
      }
      else {
        if (local_1b0[0].character != EmptyKind) {
          CVar6 = local_1f0;
          LHSKind = local_1e0._M_local_buf[0];
          if (local_1e0._M_local_buf[1] != '\x01') {
            CVar6.twine = (Twine *)&local_1f0;
            LHSKind = TwineKind;
          }
          RHS = local_1c0;
          RHSKind = local_1b0[0].character;
          if (local_1b0[0].decUI._1_1_ != '\x01') {
            RHS.twine = (Twine *)&local_1c0;
            RHSKind = TwineKind;
          }
          llvm::Twine::Twine((Twine *)&local_158,CVar6,LHSKind,RHS,RHSKind);
          goto LAB_0017694d;
        }
        local_148[0]._0_8_ =
             CONCAT62(local_1e0._M_allocated_capacity._2_6_,
                      CONCAT11(local_1e0._M_local_buf[1],local_1e0._M_local_buf[0]));
        local_158.decUI = local_1f0.decUI;
        local_158._4_4_ = local_1f0._4_4_;
        uVar13 = (undefined4)uStack_1e8;
        uVar14 = uStack_1e8._4_4_;
      }
      uStack_150 = CONCAT44(uVar14,uVar13);
    }
LAB_0017694d:
    llbuild::buildsystem::BuildSystemFrontendDelegate::error(pBVar12,(Twine *)&local_158);
  }
  bVar3 = false;
LAB_00176a0e:
  pthread_mutex_unlock((pthread_mutex_t *)&this->stateMutex);
  return bVar3;
}

Assistant:

bool initialize() {
    std::lock_guard<std::mutex> lock(stateMutex);

    delegateImpl->numFailedCommands = 0;
    delegateImpl->numErrors = 0;

    if (cancelled)
      return false;

    if (system) {
      // Already exists, just reset state
      system->resetForBuild();
      return true;
    }

    if (!invocation.chdirPath.empty()) {
      if (!sys::chdir(invocation.chdirPath.c_str())) {
        delegate.error(Twine("unable to honor --chdir: ") + strerror(errno));
        return false;
      }
    }

    if (!fileSystem) {
      // Catch and report client misuse of a failed build system object
      delegate.error(Twine("invalid reuse after initialization failure"));
      return false;
    }

    // Create the build system.
    system = std::make_unique<BuildSystem>(delegate, std::move(fileSystem));

    // Load the build file.
    if (!system->loadDescription(invocation.buildFilePath)) {
      system = nullptr;
      return false;
    }

    // Enable tracing, if requested.
    if (!invocation.traceFilePath.empty()) {
      const auto dir = llvm::sys::path::parent_path(invocation.traceFilePath);
      if (!system->getFileSystem().createDirectories(dir) &&
          !system->getFileSystem().getFileInfo(dir).isDirectory()) {
        delegate.error(Twine("unable to create tracing directory: " + dir));
        system = nullptr;
        return false;
      }

      std::string error;
      if (!system->enableTracing(invocation.traceFilePath, &error)) {
        delegate.error(Twine("unable to enable tracing: ") + error);
        system = nullptr;
        return false;
      }
    }

    // Attach the database.
    if (!invocation.dbPath.empty()) {
      // If the database path is relative, always make it relative to the input
      // file.
      SmallString<256> tmp;
      StringRef dbPath = invocation.dbPath;
      if (llvm::sys::path::is_relative(invocation.dbPath) &&
          dbPath.find("://") == StringRef::npos && !dbPath.startswith(":")) {
        llvm::sys::path::append(
            tmp, llvm::sys::path::parent_path(invocation.buildFilePath),
            invocation.dbPath);
        dbPath = tmp.str();
      }

      std::string error;
      if (!system->attachDB(dbPath, &error)) {
        delegate.error(Twine("unable to attach DB: ") + error);
        system = nullptr;
        return false;
      }
    }

    return true;
  }